

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
Parser_modelWithInvalidUnits_Test::~Parser_modelWithInvalidUnits_Test
          (Parser_modelWithInvalidUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, modelWithInvalidUnits)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\" temperature=\"451\">\n"
        "    <unit multiplier=\"Z\" exponent=\"35.0E+310\" units=\"kelvin\" bill=\"murray\">\n"
        "      <degrees/>\n"
        "    </unit>\n"
        "    <unit multiplier=\"-35.0E+310\" units=\"kelvin\"/>\n"
        "    <bobshouse address=\"34 Rich Lane\"/>\n"
        "    <unit GUnit=\"50c\"/>\n"
        "  </units>\n"
        "  <units name=\"dimensionless\"/>\n"
        "  <units jerry=\"seinfeld\">\n"
        "    <unit units=\"friends\" neighbor=\"kramer\"/>\n"
        "    <unit george=\"friends\"/>\n"
        "  </units>\n"
        "</model>\n";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <units name=\"fahrenheitish\">\n"
        "    <unit units=\"kelvin\"/>\n"
        "    <unit units=\"kelvin\"/>\n"
        "    <unit units=\"\"/>\n"
        "  </units>\n"
        "  <units>\n"
        "    <unit units=\"friends\"/>\n"
        "    <unit units=\"\"/>\n"
        "  </units>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Units 'fahrenheitish' has an invalid attribute 'temperature'.",
        "Unit referencing 'kelvin' in units 'fahrenheitish' has an invalid child element 'degrees'.",
        "Unit referencing 'kelvin' in units 'fahrenheitish' has a multiplier with the value 'Z' that is not a representation of a CellML real valued number.",
        "Unit referencing 'kelvin' in units 'fahrenheitish' has an exponent with the value '35.0E+310' that is a representation of a CellML real valued number, but out of range of the 'double' type.",
        "Unit referencing 'kelvin' in units 'fahrenheitish' has an invalid attribute 'bill'.",
        "Unit referencing 'kelvin' in units 'fahrenheitish' has a multiplier with the value '-35.0E+310' that is a representation of a CellML real valued number, but out of range of the 'double' type.",
        "Units 'fahrenheitish' has an invalid child element 'bobshouse'.",
        "Unit referencing '' in units 'fahrenheitish' has an invalid attribute 'GUnit'.",
        "Unit does not specify a units attribute.",
        "Units '' has an invalid attribute 'jerry'.",
        "Units does not specify a name attribute.",
        "Unit referencing 'friends' in units '' has an invalid attribute 'neighbor'.",
        "Unit referencing '' in units '' has an invalid attribute 'george'.",
        "Unit does not specify a units attribute.",
    };

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    EXPECT_EQ_ISSUES(expectedIssues, parser);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}